

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O3

int uv_uptime(double *uptime)

{
  int iVar1;
  int *piVar2;
  timespec now;
  timespec local_18;
  
  if (uv_uptime::no_clock_boottime == 0) {
    iVar1 = clock_gettime(7,&local_18);
    if (iVar1 == 0) goto LAB_00490dc9;
    piVar2 = __errno_location();
    if (*piVar2 != 0x16) goto LAB_00490dc3;
    uv_uptime::no_clock_boottime = 1;
  }
  iVar1 = clock_gettime(1,&local_18);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
LAB_00490dc3:
    return -*piVar2;
  }
LAB_00490dc9:
  *uptime = (double)local_18.tv_sec;
  return 0;
}

Assistant:

int uv_uptime(double* uptime) {
  static volatile int no_clock_boottime;
  struct timespec now;
  int r;

  /* Try CLOCK_BOOTTIME first, fall back to CLOCK_MONOTONIC if not available
   * (pre-2.6.39 kernels). CLOCK_MONOTONIC doesn't increase when the system
   * is suspended.
   */
  if (no_clock_boottime) {
    retry: r = clock_gettime(CLOCK_MONOTONIC, &now);
  }
  else if ((r = clock_gettime(CLOCK_BOOTTIME, &now)) && errno == EINVAL) {
    no_clock_boottime = 1;
    goto retry;
  }

  if (r)
    return UV__ERR(errno);

  *uptime = now.tv_sec;
  return 0;
}